

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O3

size_t OPENSSL_sk_insert(OPENSSL_STACK *sk,void *p,size_t where)

{
  ulong uVar1;
  void **ppvVar2;
  size_t __n;
  size_t sVar3;
  
  if (sk == (OPENSSL_STACK *)0x0) {
LAB_00198cc0:
    sVar3 = 0;
  }
  else {
    sVar3 = sk->num;
    if (0x7ffffffe < sVar3) {
      ERR_put_error(0xe,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                    ,0x8b);
      return 0;
    }
    uVar1 = sk->num_alloc;
    if (uVar1 <= sVar3 + 1) {
      ppvVar2 = (void **)OPENSSL_realloc(sk->data,uVar1 << 4);
      if (ppvVar2 == (void **)0x0) goto LAB_00198cc0;
      sk->data = ppvVar2;
      sk->num_alloc = uVar1 * 2;
      sVar3 = sk->num;
    }
    if (sVar3 < where || sVar3 - where == 0) {
      ppvVar2 = sk->data + sVar3;
    }
    else {
      __n = (sVar3 - where) * 8;
      ppvVar2 = sk->data;
      if (__n != 0) {
        memmove(ppvVar2 + where + 1,ppvVar2 + where,__n);
        sVar3 = sk->num;
        ppvVar2 = sk->data;
      }
      ppvVar2 = ppvVar2 + where;
    }
    *ppvVar2 = p;
    sVar3 = sVar3 + 1;
    sk->num = sVar3;
    sk->sorted = 0;
  }
  return sVar3;
}

Assistant:

size_t OPENSSL_sk_insert(OPENSSL_STACK *sk, void *p, size_t where) {
  if (sk == NULL) {
    return 0;
  }

  if (sk->num >= INT_MAX) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
    return 0;
  }

  if (sk->num_alloc <= sk->num + 1) {
    // Attempt to double the size of the array.
    size_t new_alloc = sk->num_alloc << 1;
    size_t alloc_size = new_alloc * sizeof(void *);
    void **data;

    // If the doubling overflowed, try to increment.
    if (new_alloc < sk->num_alloc || alloc_size / sizeof(void *) != new_alloc) {
      new_alloc = sk->num_alloc + 1;
      alloc_size = new_alloc * sizeof(void *);
    }

    // If the increment also overflowed, fail.
    if (new_alloc < sk->num_alloc || alloc_size / sizeof(void *) != new_alloc) {
      return 0;
    }

    data = reinterpret_cast<void **>(OPENSSL_realloc(sk->data, alloc_size));
    if (data == NULL) {
      return 0;
    }

    sk->data = data;
    sk->num_alloc = new_alloc;
  }

  if (where >= sk->num) {
    sk->data[sk->num] = p;
  } else {
    OPENSSL_memmove(&sk->data[where + 1], &sk->data[where],
                    sizeof(void *) * (sk->num - where));
    sk->data[where] = p;
  }

  sk->num++;
  sk->sorted = 0;

  return sk->num;
}